

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

bool __thiscall pbrt::SimplePrimitive::IntersectP(SimplePrimitive *this,Ray *r,Float tMax)

{
  ulong uVar1;
  bool bVar2;
  DispatchSplit<6> local_21;
  Float local_20;
  Float local_1c;
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  local_18;
  
  uVar1 = (this->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  local_1c = tMax;
  if ((uint)(uVar1 >> 0x31) < 5 || (MixMaterial *)(uVar1 & 0xffffffffffff) == (MixMaterial *)0x0) {
LAB_004332fe:
    local_18.bits =
         (this->shape).
         super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
         .bits;
    bVar2 = detail::DispatchSplit<6>::operator()
                      (&local_21,r,&local_1c,&local_18,local_18.bits >> 0x30);
  }
  else {
    if ((uVar1 & 0xffff000000000000) != 0xa000000000000) {
      local_20 = tMax;
      bVar2 = MixMaterial::IsTransparent((MixMaterial *)(uVar1 & 0xffffffffffff));
      local_1c = local_20;
      if (!bVar2) goto LAB_004332fe;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SimplePrimitive::IntersectP(const Ray &r, Float tMax) const {
    if (material && material.IsTransparent())
        return false;
    return shape.IntersectP(r, tMax);
}